

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_>::Data
          (Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *this,
          Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *other,size_t reserved)

{
  undefined8 uVar1;
  long lVar2;
  bool bVar3;
  size_t sVar4;
  ProKey *pPVar5;
  long in_RSI;
  Span<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *in_RDI;
  long in_FS_OFFSET;
  R RVar6;
  size_t otherNSpans;
  Node<ProKey,_QMakeInternal::QMakeBuiltin> *newNode;
  Node<ProKey,_QMakeInternal::QMakeBuiltin> *n;
  size_t index;
  Span *span;
  size_t s;
  Bucket it;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff70;
  Span<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *this_00;
  ProKey *key;
  size_t in_stack_ffffffffffffffb0;
  ulong i;
  ProKey *local_40;
  unsigned_long local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::QBasicAtomicInteger
            (in_stack_ffffffffffffff70,(int)((ulong)in_RDI >> 0x20));
  (((ProKey *)in_RDI->offsets)->super_ProString).m_string.d.ptr = *(char16_t **)(in_RSI + 8);
  (((ProKey *)in_RDI->offsets)->super_ProString).m_string.d.size = 0;
  uVar1 = *(undefined8 *)(in_RSI + 0x18);
  *(int *)(in_RDI->offsets + 0x18) = (int)uVar1;
  *(int *)(in_RDI->offsets + 0x1c) = (int)((ulong)uVar1 >> 0x20);
  *(undefined8 *)&(((ProKey *)in_RDI->offsets)->super_ProString).m_file = 0;
  qMax<unsigned_long>((unsigned_long *)
                      &(((ProKey *)in_RDI->offsets)->super_ProString).m_string.d.ptr,&local_20);
  sVar4 = GrowthPolicy::bucketsForCapacity((size_t)in_RDI);
  (((ProKey *)in_RDI->offsets)->super_ProString).m_string.d.size = sVar4;
  RVar6 = allocateSpans(in_stack_ffffffffffffffb0);
  *(Span **)&(((ProKey *)in_RDI->offsets)->super_ProString).m_file = RVar6.spans;
  pPVar5 = (ProKey *)(*(ulong *)(in_RSI + 0x10) >> 7);
  this_00 = in_RDI;
  key = pPVar5;
  for (local_40 = (ProKey *)0x0; local_40 < pPVar5;
      local_40 = (ProKey *)((long)&(local_40->super_ProString).m_string.d.d + 1)) {
    lVar2 = *(long *)(in_RSI + 0x20);
    for (i = 0; i < 0x80; i = i + 1) {
      bVar3 = Span<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_>::hasNode
                        ((Span<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *)
                         (lVar2 + (long)local_40 * 0x90),i);
      if (bVar3) {
        Span<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_>::at(this_00,(size_t)in_RDI);
        local_18.index = 0xaaaaaaaaaaaaaaaa;
        local_18.span = (Span *)0xaaaaaaaaaaaaaaaa;
        local_18 = findBucket<ProKey>((Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_>
                                       *)RVar6.spans,key);
        Bucket::insert((Bucket *)0x2dcd17);
        Node<ProKey,_QMakeInternal::QMakeBuiltin>::Node
                  ((Node<ProKey,_QMakeInternal::QMakeBuiltin> *)this_00,
                   (Node<ProKey,_QMakeInternal::QMakeBuiltin> *)in_RDI);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }